

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# shanten.cpp
# Opt level: O2

bool mahjong::is_knitted_straight_wait
               (tile_t *standing_tiles,intptr_t standing_cnt,useful_table_t *waiting_table)

{
  int i;
  long lVar1;
  long lVar2;
  uint uVar3;
  long lVar4;
  byte *pbVar5;
  bool bVar6;
  intptr_t iStack_160;
  tile_t missing_tiles [9];
  uint16_t local_148 [72];
  tile_table_t cnt_table;
  
  if ((standing_tiles == (tile_t *)0x0) || ((standing_cnt != 0xd && (standing_cnt != 10)))) {
LAB_00106959:
    uVar3 = 0;
  }
  else {
    map_tiles(standing_tiles,standing_cnt,&cnt_table);
    pbVar5 = &standard_knitted_straight;
    for (lVar1 = 0; uVar3 = 0, lVar2 = -9, lVar1 != 6; lVar1 = lVar1 + 1) {
      for (; lVar2 != 0; lVar2 = lVar2 + 1) {
        if (cnt_table[pbVar5[lVar2 + 9]] == 0) {
          lVar4 = (long)(int)uVar3;
          uVar3 = uVar3 + 1;
          missing_tiles[lVar4] = pbVar5[lVar2 + 9];
        }
      }
      if ((int)uVar3 < 2) {
        if (waiting_table != (useful_table_t *)0x0) {
          *(bool *)((long)waiting_table + 0x30) = false;
          *(bool *)((long)waiting_table + 0x31) = false;
          *(bool *)((long)waiting_table + 0x32) = false;
          *(bool *)((long)waiting_table + 0x33) = false;
          *(bool *)((long)waiting_table + 0x34) = false;
          *(bool *)((long)waiting_table + 0x35) = false;
          *(bool *)((long)waiting_table + 0x36) = false;
          *(bool *)((long)waiting_table + 0x37) = false;
          *(bool *)((long)waiting_table + 0x38) = false;
          *(bool *)((long)waiting_table + 0x39) = false;
          *(bool *)((long)waiting_table + 0x3a) = false;
          *(bool *)((long)waiting_table + 0x3b) = false;
          *(bool *)((long)waiting_table + 0x3c) = false;
          *(bool *)((long)waiting_table + 0x3d) = false;
          *(bool *)((long)waiting_table + 0x3e) = false;
          *(bool *)((long)waiting_table + 0x3f) = false;
          *(bool *)((long)waiting_table + 0x20) = false;
          *(bool *)((long)waiting_table + 0x21) = false;
          *(bool *)((long)waiting_table + 0x22) = false;
          *(bool *)((long)waiting_table + 0x23) = false;
          *(bool *)((long)waiting_table + 0x24) = false;
          *(bool *)((long)waiting_table + 0x25) = false;
          *(bool *)((long)waiting_table + 0x26) = false;
          *(bool *)((long)waiting_table + 0x27) = false;
          *(bool *)((long)waiting_table + 0x28) = false;
          *(bool *)((long)waiting_table + 0x29) = false;
          *(bool *)((long)waiting_table + 0x2a) = false;
          *(bool *)((long)waiting_table + 0x2b) = false;
          *(bool *)((long)waiting_table + 0x2c) = false;
          *(bool *)((long)waiting_table + 0x2d) = false;
          *(bool *)((long)waiting_table + 0x2e) = false;
          *(bool *)((long)waiting_table + 0x2f) = false;
          *(bool *)((long)waiting_table + 0x10) = false;
          *(bool *)((long)waiting_table + 0x11) = false;
          *(bool *)((long)waiting_table + 0x12) = false;
          *(bool *)((long)waiting_table + 0x13) = false;
          *(bool *)((long)waiting_table + 0x14) = false;
          *(bool *)((long)waiting_table + 0x15) = false;
          *(bool *)((long)waiting_table + 0x16) = false;
          *(bool *)((long)waiting_table + 0x17) = false;
          *(bool *)((long)waiting_table + 0x18) = false;
          *(bool *)((long)waiting_table + 0x19) = false;
          *(bool *)((long)waiting_table + 0x1a) = false;
          *(bool *)((long)waiting_table + 0x1b) = false;
          *(bool *)((long)waiting_table + 0x1c) = false;
          *(bool *)((long)waiting_table + 0x1d) = false;
          *(bool *)((long)waiting_table + 0x1e) = false;
          *(bool *)((long)waiting_table + 0x1f) = false;
          *(bool *)((long)waiting_table + 0) = false;
          *(bool *)((long)waiting_table + 1) = false;
          *(bool *)((long)waiting_table + 2) = false;
          *(bool *)((long)waiting_table + 3) = false;
          *(bool *)((long)waiting_table + 4) = false;
          *(bool *)((long)waiting_table + 5) = false;
          *(bool *)((long)waiting_table + 6) = false;
          *(bool *)((long)waiting_table + 7) = false;
          *(bool *)((long)waiting_table + 8) = false;
          *(bool *)((long)waiting_table + 9) = false;
          *(bool *)((long)waiting_table + 10) = false;
          *(bool *)((long)waiting_table + 0xb) = false;
          *(bool *)((long)waiting_table + 0xc) = false;
          *(bool *)((long)waiting_table + 0xd) = false;
          *(bool *)((long)waiting_table + 0xe) = false;
          *(bool *)((long)waiting_table + 0xf) = false;
          *(bool *)((long)waiting_table + 0x40) = false;
          *(bool *)((long)waiting_table + 0x41) = false;
          *(bool *)((long)waiting_table + 0x42) = false;
          *(bool *)((long)waiting_table + 0x43) = false;
          *(bool *)((long)waiting_table + 0x44) = false;
          *(bool *)((long)waiting_table + 0x45) = false;
          *(bool *)((long)waiting_table + 0x46) = false;
          *(bool *)((long)waiting_table + 0x47) = false;
        }
        memcpy(local_148,cnt_table,0x90);
        lVar1 = 9;
        while (bVar6 = lVar1 != 0, lVar1 = lVar1 + -1, bVar6) {
          if (cnt_table[(ulong)*pbVar5 - 0x48] != 0) {
            cnt_table[(ulong)*pbVar5 - 0x48] = cnt_table[(ulong)*pbVar5 - 0x48] - 1;
          }
          pbVar5 = pbVar5 + 1;
        }
        if (uVar3 == 0) {
          if (standing_cnt == 10) {
            bVar6 = is_basic_form_wait_1(&local_148,waiting_table);
          }
          else {
            bVar6 = is_basic_form_wait_recursively(&local_148,4,waiting_table);
          }
          uVar3 = (uint)bVar6;
          break;
        }
        if (uVar3 == 1) {
          if (standing_cnt == 10) {
            iStack_160 = 2;
          }
          else {
            iStack_160 = 5;
          }
          bVar6 = is_basic_form_win_recursively(&local_148,iStack_160);
          uVar3 = (uint)bVar6;
          if (bVar6 && waiting_table != (useful_table_t *)0x0) {
            (*waiting_table)[missing_tiles[0]] = true;
            uVar3 = 1;
          }
          break;
        }
        goto LAB_00106959;
      }
      pbVar5 = pbVar5 + 9;
    }
  }
  return SUB41(uVar3,0);
}

Assistant:

bool is_knitted_straight_wait(const tile_t *standing_tiles, intptr_t standing_cnt, useful_table_t *waiting_table) {
    if (standing_tiles == nullptr || (standing_cnt != 13 && standing_cnt != 10)) {
        return false;
    }

    // 对立牌的种类进行打表
    tile_table_t cnt_table;
    map_tiles(standing_tiles, standing_cnt, &cnt_table);

    return is_knitted_straight_wait_from_table(cnt_table, standing_cnt, waiting_table);
}